

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

SourceFile * __thiscall SourceFiles::lookupFile(SourceFiles *this,QMakeLocalFileName *f)

{
  SourceFile *pSVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QMakeLocalFileName::local(f);
  QString::toLatin1_helper((QString *)&local_30);
  if (local_30.ptr == (char *)0x0) {
    local_30.ptr = (char *)&QByteArray::_empty;
  }
  pSVar1 = lookupFile(this,local_30.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pSVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline SourceFile *lookupFile(const QMakeLocalFileName &f) { return lookupFile(f.local().toLatin1().constData()); }